

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlValidNormalizeString(xmlChar *str)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  xmlChar *src;
  
  pxVar2 = str + -1;
  do {
    pxVar1 = pxVar2 + 1;
    pxVar2 = pxVar2 + 1;
  } while (*pxVar1 == ' ');
LAB_00190eab:
  xVar3 = *pxVar2;
  if (xVar3 == ' ') goto LAB_00190e98;
  if (xVar3 == '\0') {
    *str = '\0';
    return;
  }
  pxVar2 = pxVar2 + 1;
  goto LAB_00190ea6;
LAB_00190e98:
  for (; *pxVar2 == ' '; pxVar2 = pxVar2 + 1) {
  }
  if (*pxVar2 != '\0') {
    xVar3 = ' ';
LAB_00190ea6:
    *str = xVar3;
    str = str + 1;
  }
  goto LAB_00190eab;
}

Assistant:

static void
xmlValidNormalizeString(xmlChar *str) {
    xmlChar *dst;
    const xmlChar *src;

    if (str == NULL)
        return;
    src = str;
    dst = str;

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
}